

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStage.h
# Opt level: O1

OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
* __thiscall
teetime::AbstractStage::addNewOutputPort<std::pair<std::__cxx11::string,teetime::Image>>
          (AbstractStage *this)

{
  _Head_base<0UL,_teetime::AbstractOutputPort_*,_false> _Var1;
  logic_error *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<teetime::AbstractOutputPort,_std::default_delete<teetime::AbstractOutputPort>_>
  local_18;
  
  if (this->m_state == Created) {
    _Var1._M_head_impl = (AbstractOutputPort *)operator_new(0x18);
    ((_Var1._M_head_impl)->super_AbstractPort).m_owner = this;
    ((AbstractPort *)&((_Var1._M_head_impl)->super_AbstractPort)._vptr_AbstractPort)->
    _vptr_AbstractPort = (_func_int **)&PTR__OutputPort_0014a738;
    (((unique_ptr<teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>,_std::default_delete<teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>_>_>
       *)(_Var1._M_head_impl + 1))->_M_t).
    super___uniq_ptr_impl<teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>,_std::default_delete<teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>_*,_std::default_delete<teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>_>_>
    .
    super__Head_base<0UL,_teetime::Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>_*,_false>
    ._M_head_impl =
         (Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
          *)0x0;
    local_18._M_t.
    super__Tuple_impl<0UL,_teetime::AbstractOutputPort_*,_std::default_delete<teetime::AbstractOutputPort>_>
    .super__Head_base<0UL,_teetime::AbstractOutputPort_*,_false>._M_head_impl =
         (tuple<teetime::AbstractOutputPort_*,_std::default_delete<teetime::AbstractOutputPort>_>)
         (tuple<teetime::AbstractOutputPort_*,_std::default_delete<teetime::AbstractOutputPort>_>)
         _Var1._M_head_impl;
    std::
    vector<std::unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>,std::allocator<std::unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>>>
    ::
    emplace_back<std::unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>>
              ((vector<std::unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>,std::allocator<std::unique_ptr<teetime::AbstractOutputPort,std::default_delete<teetime::AbstractOutputPort>>>>
                *)&this->m_outputPorts,
               (unique_ptr<teetime::AbstractOutputPort,_std::default_delete<teetime::AbstractOutputPort>_>
                *)&local_18);
    if ((_Tuple_impl<0UL,_teetime::AbstractOutputPort_*,_std::default_delete<teetime::AbstractOutputPort>_>
         )local_18._M_t.
          super__Tuple_impl<0UL,_teetime::AbstractOutputPort_*,_std::default_delete<teetime::AbstractOutputPort>_>
          .super__Head_base<0UL,_teetime::AbstractOutputPort_*,_false>._M_head_impl !=
        (AbstractOutputPort *)0x0) {
      (**(code **)(*(long *)local_18._M_t.
                            super__Tuple_impl<0UL,_teetime::AbstractOutputPort_*,_std::default_delete<teetime::AbstractOutputPort>_>
                            .super__Head_base<0UL,_teetime::AbstractOutputPort_*,_false>.
                            _M_head_impl + 8))();
    }
    return (OutputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
            *)(_Head_base<0UL,_teetime::AbstractOutputPort_*,_false>)_Var1._M_head_impl;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"cannot create new ports after stage has been started");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

OutputPort<T>* AbstractStage::addNewOutputPort()
  {
    if(m_state != StageState::Created)
    {
      throw std::logic_error("cannot create new ports after stage has been started");
    }

    OutputPort<T>* port = new OutputPort<T>(this);
    m_outputPorts.push_back(unique_ptr<AbstractOutputPort>(port));
    return port;
  }